

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

iterator __thiscall
QVLABase<QAbstractButton_*>::insert_impl
          (QVLABase<QAbstractButton_*> *this,qsizetype prealloc,void *array,const_iterator before,
          qsizetype n,QAbstractButton **t)

{
  void *pvVar1;
  void *pvVar2;
  iterator ppQVar3;
  
  pvVar1 = (this->super_QVLABaseBase).ptr;
  resize_impl(this,prealloc,array,(this->super_QVLABaseBase).s + n,t);
  pvVar2 = (this->super_QVLABaseBase).ptr;
  ppQVar3 = (iterator)(((long)before - (long)pvVar1) + (long)pvVar2);
  std::_V2::__rotate<unsigned_char*>
            (ppQVar3,(long)pvVar2 + n * -8 + (this->super_QVLABaseBase).s * 8);
  return ppQVar3;
}

Assistant:

Q_OUTOFLINE_TEMPLATE auto QVLABase<T>::insert_impl(qsizetype prealloc, void *array, const_iterator before, qsizetype n, const T &t) -> iterator
{
    Q_ASSERT_X(isValidIterator(before), "QVarLengthArray::insert", "The specified const_iterator argument 'before' is invalid");

    const qsizetype offset = qsizetype(before - cbegin());
    resize_impl(prealloc, array, size() + n, t);
    const auto b = begin() + offset;
    const auto e = end();
    QtPrivate::q_rotate(b, e - n, e);
    return b;
}